

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::cloneVariableForStage
          (ProgramInterface *this,Variable *variable,STAGES stage,GLchar *prefix,
          VaryingPassthrough *varying_passthrough)

{
  STORAGE storage;
  Variable *in;
  Variable *out;
  TestError *this_00;
  
  storage = variable->m_storage;
  if (storage - UNIFORM < 2) {
    cloneVariableForStage(this,variable,stage,storage,prefix);
    return;
  }
  if (storage == VARYING_OUTPUT) {
    in = cloneVariableForStage(this,variable,stage,VARYING_INPUT,prefix);
    if (stage == FRAGMENT) {
      return;
    }
    out = cloneVariableForStage(this,variable,stage,VARYING_OUTPUT,prefix);
    VaryingPassthrough::Add(varying_passthrough,stage,in,out);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x1204);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ProgramInterface::cloneVariableForStage(const Variable& variable, Shader::STAGES stage, const GLchar* prefix,
											 VaryingPassthrough& varying_passthrough)
{
	switch (variable.m_storage)
	{
	case Variable::VARYING_OUTPUT:
	{
		Variable* in = cloneVariableForStage(variable, stage, Variable::VARYING_INPUT, prefix);

		if (Shader::FRAGMENT != stage)
		{
			Variable* out = cloneVariableForStage(variable, stage, Variable::VARYING_OUTPUT, prefix);
			varying_passthrough.Add(stage, in, out);
		}
	}
	break;
	case Variable::UNIFORM:
	case Variable::SSB:
		cloneVariableForStage(variable, stage, variable.m_storage, prefix);
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}